

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fused_activation.h
# Opt level: O0

Layer * create_activation_layer(int activation_type,Mat *activation_params,Option *opt)

{
  ParamDict *this;
  undefined8 in_RDX;
  long *in_RSI;
  int in_EDI;
  ParamDict pd_5;
  ParamDict pd_4;
  ParamDict pd_3;
  ParamDict pd_2;
  ParamDict pd_1;
  ParamDict pd;
  Layer *activation;
  ParamDict *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  int index;
  ParamDict *in_stack_ffffffffffffff00;
  ParamDict local_e0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  ParamDict local_b0;
  ParamDict local_a0 [2];
  undefined1 local_80 [16];
  Layer *local_70;
  undefined8 local_68;
  long *local_60;
  undefined8 local_50;
  long *local_48;
  undefined8 local_40;
  long *local_38;
  undefined8 local_30;
  long *local_28;
  undefined8 local_20;
  long *local_18;
  undefined8 local_10;
  long *local_8;
  
  local_70 = (Layer *)0x0;
  index = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_68 = in_RDX;
  if (in_EDI == 1) {
    local_70 = ncnn::create_layer(index);
    ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff00);
    (*local_70->_vptr_Layer[2])(local_70,local_80);
    ncnn::ParamDict::~ParamDict(in_stack_fffffffffffffee0);
  }
  else {
    local_60 = in_RSI;
    if (in_EDI == 2) {
      local_70 = ncnn::create_layer(index);
      ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff00);
      local_8 = local_60;
      local_10 = 0;
      ncnn::ParamDict::set(local_a0,0,*(float *)*local_60);
      (*local_70->_vptr_Layer[2])(local_70,local_a0);
      ncnn::ParamDict::~ParamDict(in_stack_fffffffffffffee0);
    }
    else if (in_EDI == 3) {
      local_70 = ncnn::create_layer(index);
      ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff00);
      local_18 = local_60;
      local_20 = 0;
      ncnn::ParamDict::set(&local_b0,0,*(float *)*local_60);
      local_28 = local_60;
      local_30 = 1;
      ncnn::ParamDict::set(&local_b0,1,*(float *)(*local_60 + 4));
      (*local_70->_vptr_Layer[2])(local_70,&local_b0);
      ncnn::ParamDict::~ParamDict(in_stack_fffffffffffffee0);
    }
    else if (in_EDI == 4) {
      local_70 = ncnn::create_layer(index);
      ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff00);
      (*local_70->_vptr_Layer[2])(local_70,local_c0);
      ncnn::ParamDict::~ParamDict(in_stack_fffffffffffffee0);
    }
    else if (in_EDI == 5) {
      local_70 = ncnn::create_layer(index);
      ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff00);
      (*local_70->_vptr_Layer[2])(local_70,local_d0);
      ncnn::ParamDict::~ParamDict(in_stack_fffffffffffffee0);
    }
    else if (in_EDI == 6) {
      local_70 = ncnn::create_layer(index);
      ncnn::ParamDict::ParamDict(in_stack_ffffffffffffff00);
      local_38 = local_60;
      local_40 = 0;
      ncnn::ParamDict::set(&local_e0,0,*(float *)*local_60);
      local_48 = local_60;
      local_50 = 1;
      this = (ParamDict *)(*local_60 + 4);
      ncnn::ParamDict::set(&local_e0,1,*(float *)&this->_vptr_ParamDict);
      (*local_70->_vptr_Layer[2])(local_70,&local_e0);
      ncnn::ParamDict::~ParamDict(this);
    }
  }
  if (local_70 != (Layer *)0x0) {
    (*local_70->_vptr_Layer[4])(local_70,local_68);
  }
  return local_70;
}

Assistant:

static ncnn::Layer* create_activation_layer(int activation_type, const ncnn::Mat& activation_params, const ncnn::Option& opt)
{
    ncnn::Layer* activation = 0;

    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]); // slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]); // min
        pd.set(1, activation_params[1]); // max

        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 5)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Mish);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 6)
    {
        activation = ncnn::create_layer(ncnn::LayerType::HardSwish);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]); // alpha
        pd.set(1, activation_params[1]); // beta

        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    return activation;
}